

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_Constractor2_Test::TestBody(ConfidentialTxIn_Constractor2_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  const_reference pvVar6;
  AssertHelper local_850;
  Message local_848;
  ByteData256 local_840;
  string local_828;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_14;
  Message local_7f0;
  string local_7e8;
  string local_7c8;
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_13;
  size_t idx_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_778;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_peg_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_750;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_738;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_peg_vector;
  Message local_728;
  uint32_t local_720;
  uint32_t local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_12;
  Message local_700;
  string local_6f8;
  string local_6d8;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_11;
  size_t idx;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_688;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_660;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_648;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_vector;
  Message local_638;
  uint32_t local_630;
  uint32_t local_62c;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_10;
  Message local_610;
  string local_608;
  ByteData local_5e8;
  string local_5d0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_9;
  Message local_598;
  string local_590;
  ByteData local_570;
  string local_558;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_8;
  Message local_520;
  string local_518;
  ConfidentialValue local_4f8;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_7;
  Message local_498;
  string local_490;
  ConfidentialValue local_470;
  string local_448;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_6;
  Message local_410;
  string local_408;
  ByteData256 local_3e8;
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_5;
  Message local_398;
  string local_390;
  ByteData256 local_370;
  string local_358;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_4;
  Message local_320;
  string local_318;
  Script local_2f8;
  string local_2c0;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_3;
  Message local_288;
  string local_280;
  Txid local_260;
  string local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208;
  uint32_t local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  uint32_t local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar;
  ConfidentialTxIn txin3;
  undefined1 local_50 [8];
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ConfidentialTxIn_Constractor2_Test *this_local;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)&gtest_ar.message_,&exp_txid,2,0xfffffffe,&exp_script,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&exp_blinding_nonce,&exp_asset_entropy,
             &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
             &exp_inflation_keys_rangeproof,(ScriptWitness *)local_50);
  local_1d4 = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1d0,"txin3.GetVout()","exp_index",&local_1d4,&exp_index);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_1fc = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1f8,"txin3.GetSequence()","exp_sequence",&local_1fc,
             &exp_sequence);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  cfd::core::AbstractTxIn::GetTxid(&local_260,(AbstractTxIn *)&gtest_ar.message_);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_240,&local_260);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_280,&exp_txid);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_220,"txin3.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_240);
  cfd::core::Txid::~Txid(&local_260);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_288);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_2f8,(AbstractTxIn *)&gtest_ar.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_2c0,&local_2f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_318,&exp_script);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a0,"txin3.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2c0);
  cfd::core::Script::~Script(&local_2f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar2) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  cfd::core::ConfidentialTxIn::GetBlindingNonce(&local_370,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_358,&local_370);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_390,&exp_blinding_nonce);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_338,"txin3.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_358);
  cfd::core::ByteData256::~ByteData256(&local_370);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  cfd::core::ConfidentialTxIn::GetAssetEntropy(&local_3e8,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_3d0,&local_3e8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_408,&exp_asset_entropy);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3b0,"txin3.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3d0);
  cfd::core::ByteData256::~ByteData256(&local_3e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_410);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  cfd::core::ConfidentialTxIn::GetIssuanceAmount(&local_470,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_448,&local_470);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_490,&exp_issuance_amount);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_428,"txin3.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_448);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_470);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar2) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  cfd::core::ConfidentialTxIn::GetInflationKeys(&local_4f8,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_4d0,&local_4f8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_518,&exp_inflation_keys);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4b0,"txin3.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4d0);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_4f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_520);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  cfd::core::ConfidentialTxIn::GetIssuanceAmountRangeproof
            (&local_570,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_558,&local_570);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_590,&exp_issuance_amount_rangeproof);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_538,"txin3.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_558);
  cfd::core::ByteData::~ByteData(&local_570);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar2) {
    testing::Message::Message(&local_598);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  cfd::core::ConfidentialTxIn::GetInflationKeysRangeproof
            (&local_5e8,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_5d0,&local_5e8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_608,&exp_inflation_keys_rangeproof);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5b0,"txin3.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5d0);
  cfd::core::ByteData::~ByteData(&local_5e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar2) {
    testing::Message::Message(&local_610);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_62c = cfd::core::AbstractTxIn::GetScriptWitnessStackNum((AbstractTxIn *)&gtest_ar.message_);
  local_630 = cfd::core::ScriptWitness::GetWitnessNum
                        ((ScriptWitness *)
                         &exp_pegin_witness.witness_stack_.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_628,"txin3.GetScriptWitnessStackNum()",
             "exp_witness_stack.GetWitnessNum()",&local_62c,&local_630);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar2) {
    testing::Message::Message(&local_638);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_628);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_vector,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_vector);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  cfd::core::AbstractTxIn::GetScriptWitness
            ((ScriptWitness *)&exp_vector,(AbstractTxIn *)&gtest_ar.message_);
  cfd::core::ScriptWitness::GetWitness(&local_660,(ScriptWitness *)&exp_vector);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&exp_vector);
  local_648 = &local_660;
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_688 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx;
  for (gtest_ar_11.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_11.message_.ptr_,
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (local_648), sVar1.ptr_ < pbVar5;
      gtest_ar_11.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_11.message_.ptr_)->field_0x1) {
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_648,(size_type)gtest_ar_11.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_6d8,pvVar6);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_688,(size_type)gtest_ar_11.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_6f8,pvVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_6b8,"test_vector[idx].GetHex().c_str()",
               "exp_vector[idx].GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::__cxx11::string::~string((string *)&local_6d8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
    if (!bVar2) {
      testing::Message::Message(&local_700);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x73,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_700);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  }
  local_71c = cfd::core::ConfidentialTxIn::GetPeginWitnessStackNum
                        ((ConfidentialTxIn *)&gtest_ar.message_);
  local_720 = cfd::core::ScriptWitness::GetWitnessNum((ScriptWitness *)local_50);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_718,"txin3.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum()",&local_71c,&local_720);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar2) {
    testing::Message::Message(&local_728);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_peg_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_peg_vector,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_peg_vector);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  cfd::core::ConfidentialTxIn::GetPeginWitness
            ((ScriptWitness *)&exp_peg_vector,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ScriptWitness::GetWitness(&local_750,(ScriptWitness *)&exp_peg_vector);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&exp_peg_vector);
  local_738 = &local_750;
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (ScriptWitness *)local_50);
  local_778 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1;
  for (gtest_ar_13.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_13.message_.ptr_,
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (local_778), sVar1.ptr_ < pbVar5;
      gtest_ar_13.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_13.message_.ptr_)->field_0x1) {
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_738,(size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_7c8,pvVar6);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pvVar6 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                       (local_778,(size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_7e8,pvVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_7a8,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar3,pcVar4);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::__cxx11::string::~string((string *)&local_7c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
    if (!bVar2) {
      testing::Message::Message(&local_7f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0x7c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_7f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_7f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  }
  cfd::core::ConfidentialTxIn::GetWitnessHash(&local_840,(ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_828,&local_840);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_808,"txin3.GetWitnessHash().GetHex().c_str()",
             "\"c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c\"",pcVar3,
             "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  std::__cxx11::string::~string((string *)&local_828);
  cfd::core::ByteData256::~ByteData256(&local_840);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar2) {
    testing::Message::Message(&local_848);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              (&local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_850,&local_848);
    testing::internal::AssertHelper::~AssertHelper(&local_850);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_750);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_660);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)&gtest_ar.message_);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_50);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor2) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin3(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_EQ(txin3.GetVout(), exp_index);
  EXPECT_EQ(txin3.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin3.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin3.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin3.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin3.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_EQ(txin3.GetScriptWitnessStackNum(),
      exp_witness_stack.GetWitnessNum());
  const std::vector<ByteData>& test_vector = txin3.GetScriptWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_vector = exp_witness_stack.GetWitness();
  for (size_t idx = 0; idx < test_vector.size(); ++idx) {
    EXPECT_STREQ(test_vector[idx].GetHex().c_str(),
        exp_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(txin3.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum());
  const std::vector<ByteData>& test_peg_vector = txin3.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(txin3.GetWitnessHash().GetHex().c_str(),
    "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
}